

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::TextureBufferCase::iterate(TextureBufferCase *this)

{
  deUint32 dVar1;
  int iVar2;
  char *str;
  undefined4 extraout_var;
  int local_58 [2];
  deInt32 alignment;
  long local_48;
  Functions *gl;
  size_t offset;
  Random rng;
  TextureBufferCase *this_local;
  
  rng.m_rnd._8_8_ = this;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  dVar1 = deInt32Hash(dVar1);
  de::Random::Random((Random *)&offset,dVar1);
  if (this->m_offset == 0) {
    gl = (Functions *)0x0;
  }
  else {
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    local_48 = CONCAT44(extraout_var,iVar2);
    local_58[0] = 0;
    (**(code **)(local_48 + 0x868))(0x919f,local_58);
    dVar1 = (**(code **)(local_48 + 0x800))();
    glu::checkError(dVar1,"glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                    ,0x407);
    gl = (Functions *)(this->m_offset * (long)local_58[0]);
  }
  anon_unknown_1::runTests
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,(Random *)&offset,
             this->m_format,this->m_bufferSize,(size_t)gl,this->m_size,this->m_preRender,
             this->m_preRenderProgram,this->m_modify,this->m_postRender,this->m_postRenderProgram);
  de::Random::~Random((Random *)&offset);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureBufferCase::iterate (void)
{
	de::Random	rng		(deInt32Hash(deStringHash(getName())));
	size_t		offset;

	if (m_offset != 0)
	{
		const glw::Functions&	gl			= m_renderCtx.getFunctions();
		deInt32					alignment	= 0;

		gl.getIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT, &alignment);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_TEXTURE_BUFFER_OFFSET_ALIGNMENT)");

		offset = m_offset * alignment;
	}
	else
		offset = 0;

	runTests(m_testCtx, m_renderCtx, rng, m_format, m_bufferSize, offset, m_size, m_preRender, m_preRenderProgram, m_modify, m_postRender, m_postRenderProgram);

	return STOP;
}